

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall amrex::AmrLevel::restart(AmrLevel *this,Amr *papa,istream *is,bool bReadSpecial)

{
  initializer_list<int> iVar1;
  bool bVar2;
  int iVar3;
  IndexSpace *pIVar4;
  int *piVar5;
  byte in_CL;
  StateDescriptor *in_RDX;
  Amr *in_RSI;
  AmrLevel *in_RDI;
  IntVect IVar6;
  AmrLevel *unaff_retaddr;
  int i;
  Vector<int,_std::allocator<int>_> state_in_checkpoint;
  int ndesc;
  int nstate;
  StateDescriptor *in_stack_fffffffffffffde8;
  int iVar7;
  BoxArray *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  AmrMesh *in_stack_fffffffffffffe00;
  size_type in_stack_fffffffffffffe08;
  istream *in_stack_fffffffffffffe10;
  BoxArray *in_stack_fffffffffffffe18;
  BoxArray *in_stack_fffffffffffffe20;
  Geometry *in_stack_fffffffffffffe28;
  istream *in_stack_fffffffffffffe38;
  BoxArray *in_stack_fffffffffffffe40;
  int local_174;
  FabFactory<amrex::FArrayBox> local_164;
  undefined4 local_15c;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffffea8;
  DistributionMapping *in_stack_fffffffffffffeb0;
  BoxArray *in_stack_fffffffffffffeb8;
  Box *in_stack_fffffffffffffec0;
  Geometry *in_stack_fffffffffffffec8;
  StateData *in_stack_fffffffffffffed0;
  undefined1 local_110 [24];
  int local_f8;
  int local_f4;
  int local_f0 [3];
  undefined8 local_dc;
  int local_d4;
  int local_d0 [3];
  undefined8 local_bc;
  int local_b4;
  int local_b0 [2];
  int local_a8;
  int local_9c [2];
  int local_94;
  int local_90 [2];
  int local_88;
  int local_80 [2];
  int local_78;
  byte local_71;
  IntVect local_44;
  int local_38 [2];
  int local_30;
  IntVect local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_71 = in_CL & 1;
  in_RDI->parent = in_RSI;
  std::istream::operator>>(in_RDX,&in_RDI->level);
  amrex::operator>>((istream *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  IntVect::IntVect(&local_28,1);
  local_30 = local_28.vect[2];
  local_38[0] = local_28.vect[0];
  local_38[1] = local_28.vect[1];
  local_88 = local_28.vect[2];
  local_90[0] = local_28.vect[0];
  local_90[1] = local_28.vect[1];
  local_78 = local_28.vect[2];
  local_80[0] = local_28.vect[0];
  local_80[1] = local_28.vect[1];
  local_8 = &in_RDI->fine_ratio;
  (in_RDI->fine_ratio).vect[2] = local_28.vect[2];
  *(undefined8 *)(in_RDI->fine_ratio).vect = local_28.vect._0_8_;
  local_c = 0xffffffff;
  local_8->vect[0] = -local_8->vect[0];
  (in_RDI->fine_ratio).vect[1] = -(in_RDI->fine_ratio).vect[1];
  (in_RDI->fine_ratio).vect[2] = -(in_RDI->fine_ratio).vect[2];
  IntVect::IntVect(&local_44,1);
  local_a8 = local_44.vect[2];
  local_b0[0] = local_44.vect[0];
  local_b0[1] = local_44.vect[1];
  local_9c[0] = local_44.vect[0];
  local_9c[1] = local_44.vect[1];
  local_94 = local_44.vect[2];
  *(undefined8 *)(in_RDI->crse_ratio).vect = local_44.vect._0_8_;
  (in_RDI->crse_ratio).vect[2] = local_44.vect[2];
  local_18 = &in_RDI->crse_ratio;
  local_1c = 0xffffffff;
  local_18->vect[0] = -local_18->vect[0];
  (in_RDI->crse_ratio).vect[1] = -(in_RDI->crse_ratio).vect[1];
  (in_RDI->crse_ratio).vect[2] = -(in_RDI->crse_ratio).vect[2];
  if (0 < in_RDI->level) {
    IVar6 = AmrMesh::refRatio(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
    local_d0._0_8_ = IVar6.vect._0_8_;
    local_bc._0_4_ = local_d0[0];
    local_bc._4_4_ = local_d0[1];
    local_d0[2] = IVar6.vect[2];
    local_b4 = local_d0[2];
    *(undefined8 *)(in_RDI->crse_ratio).vect = local_d0._0_8_;
    (in_RDI->crse_ratio).vect[2] = local_d0[2];
    local_d0 = IVar6.vect;
  }
  iVar7 = in_RDI->level;
  iVar3 = AmrMesh::maxLevel((AmrMesh *)in_RDI->parent);
  if (iVar7 < iVar3) {
    IVar6 = AmrMesh::refRatio(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
    local_f0._0_8_ = IVar6.vect._0_8_;
    local_dc._0_4_ = local_f0[0];
    local_dc._4_4_ = local_f0[1];
    local_f0[2] = IVar6.vect[2];
    local_d4 = local_f0[2];
    *(undefined8 *)(in_RDI->fine_ratio).vect = local_f0._0_8_;
    (in_RDI->fine_ratio).vect[2] = local_f0[2];
    local_f0 = IVar6.vect;
  }
  if ((local_71 & 1) == 0) {
    BoxArray::readFrom(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  else {
    readBoxArray(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                 SUB81(in_stack_fffffffffffffe08 >> 0x38,0));
  }
  std::istream::operator>>(in_RDX,&local_f4);
  local_f8 = DescriptorList::size((DescriptorList *)0x10f83b5);
  std::allocator<int>::allocator((allocator<int> *)0x10f83ec);
  Vector<int,_std::allocator<int>_>::vector
            ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00,
             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
             (value_type *)in_stack_fffffffffffffdf0,(allocator_type *)in_stack_fffffffffffffde8);
  std::allocator<int>::~allocator((allocator<int> *)0x10f8420);
  if (local_f4 < local_f8) {
    (*in_RDI->_vptr_AmrLevel[0xc])(in_RDI,local_110);
  }
  ParallelDescriptor::NProcs();
  DistributionMapping::define
            ((DistributionMapping *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  AmrMesh::SetBoxArray
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0);
  AmrMesh::SetDistributionMap
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
             (DistributionMapping *)in_stack_fffffffffffffdf0);
  pIVar4 = EB2::TopIndexSpaceIfPresent();
  if (pIVar4 == (IndexSpace *)0x0) {
    std::make_unique<amrex::DefaultFabFactory<amrex::FArrayBox>>();
    std::
    unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>
    ::operator=((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 *)in_stack_fffffffffffffe00,
                (unique_ptr<amrex::DefaultFabFactory<amrex::FArrayBox>,_std::default_delete<amrex::DefaultFabFactory<amrex::FArrayBox>_>_>
                 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    std::
    unique_ptr<amrex::DefaultFabFactory<amrex::FArrayBox>,_std::default_delete<amrex::DefaultFabFactory<amrex::FArrayBox>_>_>
    ::~unique_ptr((unique_ptr<amrex::DefaultFabFactory<amrex::FArrayBox>,_std::default_delete<amrex::DefaultFabFactory<amrex::FArrayBox>_>_>
                   *)in_stack_fffffffffffffdf0);
  }
  else {
    local_164._vptr_FabFactory._0_4_ = m_eb_basic_grow_cells;
    local_164._vptr_FabFactory._4_4_ = m_eb_volume_grow_cells;
    local_15c = m_eb_full_grow_cells;
    in_stack_fffffffffffffea8 = &local_164;
    in_stack_fffffffffffffeb0 = (DistributionMapping *)0x3;
    std::allocator<int>::allocator((allocator<int> *)0x10f8596);
    iVar1._M_array._4_4_ = in_stack_fffffffffffffdfc;
    iVar1._M_array._0_4_ = in_stack_fffffffffffffdf8;
    iVar1._M_len = (size_type)in_stack_fffffffffffffe00;
    Vector<int,_std::allocator<int>_>::vector
              ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdf0,iVar1,
               (allocator_type *)in_stack_fffffffffffffde8);
    makeEBFabFactory(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                     (DistributionMapping *)in_stack_fffffffffffffe18,
                     (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe10,
                     (EBSupport)(in_stack_fffffffffffffe08 >> 0x20));
    std::
    unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>
    ::operator=((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 *)in_stack_fffffffffffffe00,
                (unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    std::unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>::
    ~unique_ptr((unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                 *)in_stack_fffffffffffffe00);
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10f861d);
    std::allocator<int>::~allocator((allocator<int> *)0x10f862a);
  }
  std::vector<amrex::StateData,_std::allocator<amrex::StateData>_>::resize
            ((vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
             in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  for (local_174 = 0; local_174 < local_f8; local_174 = local_174 + 1) {
    piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdf0,
                        (size_type)in_stack_fffffffffffffde8);
    if (*piVar5 != 0) {
      Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                 in_stack_fffffffffffffdf0,(size_type)in_stack_fffffffffffffde8);
      iVar7 = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
      Geometry::Domain(&in_RDI->geom);
      std::
      unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
      ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                   *)in_stack_fffffffffffffdf0);
      in_stack_fffffffffffffde8 =
           DescriptorList::operator[]((DescriptorList *)in_stack_fffffffffffffdf0,iVar7);
      in_stack_fffffffffffffdf0 = (BoxArray *)Amr::theRestartFile_abi_cxx11_(in_RSI);
      StateData::restart(in_stack_fffffffffffffed0,(istream *)in_stack_fffffffffffffec8,
                         in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                         in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_RDX,(string *)in_RSI
                        );
    }
  }
  bVar2 = AmrMesh::useFixedCoarseGrids((AmrMesh *)in_RDI->parent);
  if (bVar2) {
    constructAreaNotToTag(unaff_retaddr);
  }
  in_RDI->post_step_regrid = 0;
  finishConstructor(in_RDI);
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10f884d);
  return;
}

Assistant:

void
AmrLevel::restart (Amr&          papa,
                   std::istream& is,
                   bool          bReadSpecial)
{
    BL_PROFILE("AmrLevel::restart()");
    parent = &papa;

    is >> level;
    is >> geom;

    fine_ratio = IntVect::TheUnitVector(); fine_ratio.scale(-1);
    crse_ratio = IntVect::TheUnitVector(); crse_ratio.scale(-1);

    if (level > 0)
    {
        crse_ratio = parent->refRatio(level-1);
    }
    if (level < parent->maxLevel())
    {
        fine_ratio = parent->refRatio(level);
    }

    if (bReadSpecial)
    {
        amrex::readBoxArray(grids, is, bReadSpecial);
    }
    else
    {
        grids.readFrom(is);
    }

    int nstate;
    is >> nstate;
    int ndesc = desc_lst.size();

    Vector<int> state_in_checkpoint(ndesc, 1);
    if (ndesc > nstate) {
        set_state_in_checkpoint(state_in_checkpoint);
    } else {
        BL_ASSERT(nstate == ndesc);
    }

    dmap.define(grids);

    parent->SetBoxArray(level, grids);
    parent->SetDistributionMap(level, dmap);

#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        m_factory = makeEBFabFactory(geom, grids, dmap,
                                     {m_eb_basic_grow_cells,
                                      m_eb_volume_grow_cells,
                                      m_eb_full_grow_cells},
                                     m_eb_support_level);
    } else
#endif
    {
        m_factory = std::make_unique<FArrayBoxFactory>();
    }

    state.resize(ndesc);
    for (int i = 0; i < ndesc; ++i)
    {
        if (state_in_checkpoint[i]) {
            state[i].restart(is, geom.Domain(), grids, dmap, *m_factory,
                             desc_lst[i], papa.theRestartFile());
        }
    }

    if (parent->useFixedCoarseGrids()) constructAreaNotToTag();

    post_step_regrid = 0;

    finishConstructor();
}